

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O3

void __thiscall
myvk::CommandBuffer::CmdCopy
          (CommandBuffer *this,Ptr<BufferBase> *src,Ptr<ImageBase> *dst,
          vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *regions,
          VkImageLayout layout)

{
  VkBufferImageCopy *pVVar1;
  
  pVVar1 = (regions->super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
           _M_impl.super__Vector_impl_data._M_start;
  (*vkCmdCopyBufferToImage)
            (this->m_command_buffer,
             ((src->super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             m_buffer,((dst->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->m_image,layout,
             (int)((ulong)((long)(regions->
                                 super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) >> 3) *
             -0x49249249,pVVar1);
  return;
}

Assistant:

void CommandBuffer::CmdCopy(const Ptr<BufferBase> &src, const Ptr<ImageBase> &dst,
                            const std::vector<VkBufferImageCopy> &regions, VkImageLayout layout) const {
	vkCmdCopyBufferToImage(m_command_buffer, src->GetHandle(), dst->GetHandle(), layout, regions.size(),
	                       regions.data());
}